

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_AActor_A_LookEx(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  AActor *this;
  PClass *pPVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  VMValue *pVVar8;
  undefined4 extraout_var_00;
  FState *newstate;
  AActor *pAVar9;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar10;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar11;
  AActor *pAVar12;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar13;
  FSoundID *sound_id;
  FState *newstate_00;
  char *pcVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  float attenuation;
  FLookExParams params;
  NActorIterator iterator;
  FSoundID local_94;
  FSoundID local_90;
  FName local_8c;
  FLookExParams local_88;
  double local_58;
  undefined8 uStack_50;
  NActorIterator local_40;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar14 = "(paramnum) < numparam";
LAB_003f3597:
    __assert_fail(pcVar14,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x816,
                  "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar14 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003f3597;
  }
  this = *(AActor **)&param->field_0;
  if (this != (AActor *)0x0) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar5 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
    }
    pPVar7 = (this->super_DThinker).super_DObject.Class;
    bVar15 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar4 && bVar15) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar15 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar4) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar15) {
      pcVar14 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f3597;
    }
  }
  if (numparam == 1) {
    pVVar8 = defaultparam->Array;
    if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
      pcVar14 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003f35b6:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x817,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    pVVar8 = param;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar14 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003f35b6;
    }
  }
  uVar3 = pVVar8[1].field_0.i;
  if (numparam < 3) {
    pVVar8 = defaultparam->Array;
    if (pVVar8[2].field_0.field_3.Type != '\x01') {
      pcVar14 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f35d5;
    }
  }
  else {
    pVVar8 = param;
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar14 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003f35d5:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x818,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  dVar1 = pVVar8[2].field_0.f;
  if (numparam < 4) {
    pVVar8 = defaultparam->Array;
    if (pVVar8[3].field_0.field_3.Type != '\x01') {
      pcVar14 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f35f4;
    }
  }
  else {
    pVVar8 = param;
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar14 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003f35f4:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x819,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  dVar2 = pVVar8[3].field_0.f;
  if (numparam < 5) {
    pVVar8 = defaultparam->Array;
    if (pVVar8[4].field_0.field_3.Type != '\x01') {
      pcVar14 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f3613;
    }
  }
  else {
    pVVar8 = param;
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar14 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003f3613:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81a,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  dVar17 = pVVar8[4].field_0.f;
  if (numparam < 6) {
    pVVar8 = defaultparam->Array;
    if (pVVar8[5].field_0.field_3.Type != '\x01') {
      pcVar14 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f3632;
    }
  }
  else {
    pVVar8 = param;
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar14 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003f3632:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81b,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  local_58 = pVVar8[5].field_0.f;
  uStack_50 = 0;
  if (numparam < 7) {
    if (defaultparam->Array[6].field_0.field_3.Type != '\0') {
      pcVar14 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003f365a;
    }
    iVar5 = defaultparam->Array[6].field_0.i;
  }
  else {
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar14 = "(param[paramnum]).Type == REGT_INT";
LAB_003f365a:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81c,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar5 = param[6].field_0.i;
  }
  if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar6 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar6);
  }
  newstate = FStateLabelStorage::GetState
                       (&StateLabels,iVar5,(PClassActor *)(this->super_DThinker).super_DObject.Class
                        ,false);
  local_88.Fov.Degrees =
       (double)(~-(ulong)(local_58 == 0.0) & (ulong)local_58 |
               (ulong)((uint)(-(ulong)(local_58 == 0.0) >> 0x20) & 0x40668000) << 0x20);
  if (((this->flags5).Value & 0x20000000) != 0) {
    return 0;
  }
  local_88.minDist = dVar1;
  local_88.maxDist = dVar2;
  local_88.maxHeardist = dVar17;
  local_88.flags = uVar3;
  local_88.seestate = newstate;
  if ((this->special == 0xe5) && (this->args[0] == 0)) {
    local_40.super_FActorIterator.id = this->args[1];
    local_40.super_FActorIterator.base = (AActor *)0x0;
    local_8c.Index = 0x111;
    local_40.type = PClass::FindClass(&local_8c);
    this->special = 0;
    pAVar9 = NActorIterator::Next(&local_40);
    (this->goal).field_0.p = pAVar9;
    this->reactiontime = this->args[2] * 0x23 + level.maptime;
    (this->flags5).Value = (uint)(this->args[3] != 0) << 7 | (this->flags5).Value & 0xffffff7f;
  }
  this->threshold = 0;
  if (this->TIDtoHate == 0) {
    if ((uVar3 & 2) == 0) {
      if (((i_compatflags._1_1_ & 8) == 0) && (((this->flags).Value & 8) == 0)) {
        paVar10 = &(this->LastHeard).field_0;
      }
      else {
        paVar10 = &(this->Sector->SoundTarget).field_0;
      }
      aVar13.p = paVar10->p;
      if ((aVar13.p != (AActor *)0x0) &&
         ((((aVar13.p)->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        paVar10->p = (AActor *)0x0;
        aVar13.p = (AActor *)0x0;
      }
      if ((aVar13.p == (AActor *)0x0) || ((aVar13.p)->health < 1)) goto LAB_003f324b;
      dVar16 = AActor::Distance2D(this,aVar13.p,false);
      if (((dVar17 != 0.0) || (NAN(dVar17))) && (dVar17 < dVar16)) {
        (this->LastHeard).field_0.p = (AActor *)0x0;
        goto LAB_003f324b;
      }
    }
    else {
LAB_003f324b:
      aVar13.p = (AActor *)0x0;
    }
    if (aVar13.p == (AActor *)0x0) goto LAB_003f326d;
    if (((aVar13.p)->player != (player_t *)0x0) && (((aVar13.p)->player->cheats & 8) != 0)) {
      return 0;
    }
  }
  else {
    aVar13 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)(this->target).field_0.p;
    if ((aVar13.p != (AActor *)0x0) &&
       ((((aVar13.p)->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->target).field_0.p = (AActor *)0x0;
LAB_003f326d:
      aVar13.p = (AActor *)0x0;
    }
  }
  if (((this->flags).Value & 0x40000000) != 0) {
    this->visdir = -1;
  }
  if ((aVar13.p != (AActor *)0x0) && ((((aVar13.p)->flags).Value & 4) != 0)) {
    bVar15 = AActor::IsFriend(this,aVar13.p);
    if (bVar15) {
      if (((this->flags4).Value & 0x20000) == 0) {
        if (((uVar3 & 1) == 0) && (bVar15 = P_LookForPlayers(this,1,&local_88), bVar15))
        goto LAB_003f32b7;
        if (((this->flags).Value & 0x2000) == 0) {
          newstate_00 = newstate;
          if ((newstate == (FState *)0x0) &&
             (newstate_00 = this->SeeState, this->SeeState == (FState *)0x0)) {
            A_Wander(this,0);
          }
          else {
            AActor::SetState(this,newstate_00,false);
          }
        }
      }
    }
    else {
      (this->target).field_0.p = (AActor *)aVar13;
      bVar15 = (((aVar13.p)->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0;
      aVar11.p = (AActor *)0x0;
      if (bVar15) {
        aVar11 = aVar13;
      }
      if (!bVar15 || aVar11.p == this) {
        aVar13.p = (AActor *)0x0;
        if (aVar11.p != this) {
          aVar13 = aVar11;
        }
        (this->target).field_0.p = (AActor *)aVar13;
      }
      pAVar9 = (this->target).field_0.p;
      if (pAVar9 != (AActor *)0x0) {
        if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (((this->flags).Value & 0x20) == 0) goto LAB_003f32b7;
          pAVar9 = (this->target).field_0.p;
          if ((pAVar9 != (AActor *)0x0) &&
             (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (this->target).field_0.p = (AActor *)0x0;
            pAVar9 = (AActor *)0x0;
          }
          dVar17 = AActor::Distance2D(this,pAVar9,false);
          pAVar9 = (this->target).field_0.p;
          if ((pAVar9 != (AActor *)0x0) &&
             (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (this->target).field_0.p = (AActor *)0x0;
            pAVar9 = (AActor *)0x0;
          }
          bVar15 = P_CheckSight(this,pAVar9,4);
          if (((bVar15) && (((dVar1 == 0.0 && (!NAN(dVar1))) || (dVar1 < dVar17)))) &&
             (((dVar2 == 0.0 && (!NAN(dVar2))) || (dVar17 < dVar2)))) goto LAB_003f32b7;
        }
        else {
          (this->target).field_0.p = (AActor *)0x0;
        }
      }
    }
  }
  if ((uVar3 & 1) != 0) {
    return 0;
  }
  bVar15 = P_LookForPlayers(this,1,&local_88);
  if (!bVar15) {
    return 0;
  }
LAB_003f32b7:
  pAVar9 = (this->goal).field_0.p;
  if ((pAVar9 != (AActor *)0x0) &&
     (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->goal).field_0.p = (AActor *)0x0;
    pAVar9 = (AActor *)0x0;
  }
  pAVar12 = (this->target).field_0.p;
  if ((pAVar12 != (AActor *)0x0) &&
     (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->target).field_0.p = (AActor *)0x0;
    pAVar12 = (AActor *)0x0;
  }
  if (pAVar12 == pAVar9) {
    if (level.maptime < this->reactiontime) {
      (this->target).field_0.p = (AActor *)0x0;
    }
  }
  else {
    iVar5 = (this->SeeSound).super_FSoundID.ID;
    if ((iVar5 != 0) && ((uVar3 & 8) == 0)) {
      if ((uVar3 & 0x10) == 0) {
        sound_id = &local_94;
        attenuation = 1.0;
        local_94.ID = iVar5;
      }
      else {
        sound_id = &local_90;
        attenuation = 0.0;
        local_90.ID = iVar5;
      }
      S_Sound(this,2,sound_id,1.0,attenuation);
    }
  }
  pAVar9 = (this->target).field_0.p;
  if (pAVar9 != (AActor *)0x0) {
    if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((uVar3 & 0x20) == 0 && ((this->flags).Value & 0x2000) == 0) {
        if (newstate == (FState *)0x0) {
          newstate = this->SeeState;
        }
        AActor::SetState(this,newstate,false);
      }
    }
    else {
      (this->target).field_0.p = (AActor *)0x0;
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LookEx)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(flags)			
	PARAM_FLOAT_DEF	(minseedist)	
	PARAM_FLOAT_DEF	(maxseedist)	
	PARAM_FLOAT_DEF (maxheardist)	
	PARAM_ANGLE_DEF (fov)			
	PARAM_STATE_DEF	(seestate)		

	AActor *targ = NULL; // Shuts up gcc
	double dist;
	if (fov == 0) fov = 180.;
	FLookExParams params = { fov, minseedist, maxseedist, maxheardist, flags, seestate };

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	// [RH] Set goal now if appropriate
	if (self->special == Thing_SetGoal && self->args[0] == 0) 
	{
		NActorIterator iterator(NAME_PatrolPoint, self->args[1]);
		self->special = 0;
		self->goal = iterator.Next ();
		self->reactiontime = self->args[2] * TICRATE + level.maptime;
		if (self->args[3] == 0)
			self->flags5 &= ~MF5_CHASEGOAL;
		else
			self->flags5 |= MF5_CHASEGOAL;
	}

	self->threshold = 0;		// any shot will wake up

	if (self->TIDtoHate != 0)
	{
		targ = self->target;
	}
	else
	{
		if (!(flags & LOF_NOSOUNDCHECK))
		{
			targ = (i_compatflags & COMPATF_SOUNDTARGET || self->flags & MF_NOSECTOR)?
				self->Sector->SoundTarget : self->LastHeard;
			if (targ != NULL)
			{
				// [RH] If the soundtarget is dead, don't chase it
				if (targ->health <= 0)
				{
					targ = NULL;
				}
				else
				{
					dist = self->Distance2D (targ);

					// [KS] If the target is too far away, don't respond to the sound.
					if (maxheardist && dist > maxheardist)
					{
						targ = NULL;
						self->LastHeard = NULL;
					}
				}
			}
        }
        
        if (targ && targ->player && (targ->player->cheats & CF_NOTARGET))
        {
            return 0;
        }
	}

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = -1;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if (self->IsFriend (targ))	// be a little more precise!
		{
			if (!(self->flags4 & MF4_STANDSTILL))
			{
				if (!(flags & LOF_NOSIGHTCHECK))
				{
					// If we find a valid target here, the wandering logic should *not*
					// be activated! If would cause the seestate to be set twice.
					if (P_LookForPlayers(self, true, &params))
						goto seeyou;
				}

				// Let the self wander around aimlessly looking for a fight
                if (!(self->flags & MF_INCHASE))
                {
                    if (seestate)
                    {
                        self->SetState (seestate);
                    }
                    else
                    {
                        if (self->SeeState != NULL)
                        {
                            self->SetState (self->SeeState);
                        }
                        else
                        {
                            A_Wander(self);
                        }
                    }
                }
			}
		}
		else
		{
			self->target = targ; //We already have a target?
            
            // [KS] The target can become ourselves in rare circumstances (like
            // if we committed suicide), so if that's the case, just ignore it.
            if (self->target == self) self->target = NULL;

			if (self->target != NULL)
			{
				if (self->flags & MF_AMBUSH)
				{
					dist = self->Distance2D (self->target);
					if (P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING) &&
						(!minseedist || dist > minseedist) &&
						(!maxseedist || dist < maxseedist))
					{
						goto seeyou;
					}
				}
				else
					goto seeyou;
			}
		}
	}

	if (!(flags & LOF_NOSIGHTCHECK))
	{
		if (!P_LookForPlayers(self, true, &params))
			return 0;
	}
	else
	{
		return 0;
	}
				
	// go into chase state
  seeyou:
	// [RH] Don't start chasing after a goal if it isn't time yet.
	if (self->target == self->goal)
	{
		if (self->reactiontime > level.maptime)
			self->target = NULL;
	}
	else if (self->SeeSound && !(flags & LOF_NOSEESOUND))
	{
		if (flags & LOF_FULLVOLSEESOUND)
		{ // full volume
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NONE);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NORM);
		}
	}

	if (self->target && !(self->flags & MF_INCHASE))
	{
        if (!(flags & LOF_NOJUMP))
        {
            if (seestate)
            {
                self->SetState (seestate);
            }
            else
            {
                self->SetState (self->SeeState);
            }
        }
	}
	return 0;
}